

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# code_simulation_helpers.hpp
# Opt level: O2

void LDPC4QKD::CodeSimulationHelpers::noise_bitstring_inplace<bool>
               (mt19937_64 *rng,vector<bool,_std::allocator<bool>_> *src,double err_prob)

{
  ulong uVar1;
  ulong *puVar2;
  _Adaptor<std::mersenne_twister_engine<unsigned_long,_64UL,_312UL,_156UL,_31UL,_13043109905998158313UL,_29UL,_6148914691236517205UL,_17UL,_8202884508482404352UL,_37UL,_18444473444759240704UL,_43UL,_6364136223846793005UL>,_double>
  __aurng;
  size_t i;
  ulong __n;
  double dVar3;
  reference rVar4;
  reference rVar5;
  reference local_50;
  reference local_40;
  
  for (__n = 0; __n < (ulong)(src->super__Bvector_base<std::allocator<bool>_>)._M_impl.
                             super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_offset +
                      ((long)(src->super__Bvector_base<std::allocator<bool>_>)._M_impl.
                             super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_p -
                      (long)(src->super__Bvector_base<std::allocator<bool>_>)._M_impl.
                            super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p) * 8;
      __n = __n + 1) {
    dVar3 = std::
            generate_canonical<double,53ul,std::mersenne_twister_engine<unsigned_long,64ul,312ul,156ul,31ul,13043109905998158313ul,29ul,6148914691236517205ul,17ul,8202884508482404352ul,37ul,18444473444759240704ul,43ul,6364136223846793005ul>>
                      (rng);
    if (err_prob <= dVar3) {
      local_40 = std::vector<bool,_std::allocator<bool>_>::operator[](src,__n);
      local_50 = std::vector<bool,_std::allocator<bool>_>::operator[](src,__n);
      std::_Bit_reference::operator=(&local_50,&local_40);
    }
    else {
      rVar4 = std::vector<bool,_std::allocator<bool>_>::operator[](src,__n);
      uVar1 = *rVar4._M_p;
      rVar5 = std::vector<bool,_std::allocator<bool>_>::operator[](src,__n);
      puVar2 = rVar5._M_p;
      if ((uVar1 & rVar4._M_mask) == 0) {
        *puVar2 = *puVar2 | rVar5._M_mask;
      }
      else {
        *puVar2 = *puVar2 & ~rVar5._M_mask;
      }
    }
  }
  return;
}

Assistant:

void noise_bitstring_inplace(std::mt19937_64 &rng, std::vector<T> &src, double err_prob) {
        std::bernoulli_distribution distribution(err_prob);

        for (std::size_t i = 0; i < src.size(); i++) {
            if (distribution(rng)) {
                src[i] = !src[i];
            } else {
                src[i] = src[i];
            }
        }
    }